

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glesv1_cm_gears.c
# Opt level: O0

void glesv1_cm_gears_draw
               (gears_t_conflict *gears,float view_tz,float view_rx,float view_ry,float model_rz)

{
  float local_58 [2];
  float blue [4];
  float green [4];
  float red [4];
  float model_rz_local;
  float view_ry_local;
  float view_rx_local;
  float view_tz_local;
  gears_t_conflict *gears_local;
  
  green[2] = 0.8;
  green[3] = 0.1;
  blue[2] = 0.0;
  blue[3] = 0.8;
  green[0] = 0.2;
  green[1] = 1.0;
  local_58[0] = 0.2;
  local_58[1] = 0.2;
  blue[0] = 1.0;
  blue[1] = 1.0;
  if (gears != (gears_t_conflict *)0x0) {
    (*gears->glClear)(0x4100);
    (*gears->glLoadIdentity)();
    (*gears->glTranslatef)(0.0,0.0,view_tz);
    (*gears->glRotatef)(view_rx,1.0,0.0,0.0);
    (*gears->glRotatef)(view_ry,0.0,1.0,0.0);
    draw_gear(gears,0,-3.0,-2.0,model_rz,green + 2);
    draw_gear(gears,1,3.1,-2.0,-9.0 - (model_rz + model_rz),blue + 2);
    draw_gear(gears,2,-3.1,4.2,-25.0 - (model_rz + model_rz),local_58);
  }
  return;
}

Assistant:

static void glesv1_cm_gears_draw(gears_t *gears, float view_tz, float view_rx, float view_ry, float model_rz)
{
  const float red[4] = { 0.8, 0.1, 0.0, 1.0 };
  const float green[4] = { 0.0, 0.8, 0.2, 1.0 };
  const float blue[4] = { 0.2, 0.2, 1.0, 1.0 };

  if (!gears) {
    return;
  }

  gears->glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);

  gears->glLoadIdentity();
  gears->glTranslatef(0, 0, view_tz);
  gears->glRotatef(view_rx, 1, 0, 0);
  gears->glRotatef(view_ry, 0, 1, 0);

  draw_gear(gears, GEAR0, -3.0, -2.0,      model_rz     , red);
  draw_gear(gears, GEAR1,  3.1, -2.0, -2 * model_rz - 9 , green);
  draw_gear(gears, GEAR2, -3.1,  4.2, -2 * model_rz - 25, blue);
}